

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alg.cpp
# Opt level: O0

double __thiscall Alg::opim(Alg *this,int targetSize,size_t numRRsets,double delta,int mode)

{
  size_t sVar1;
  uint uVar2;
  ResultInfo *pRVar3;
  size_t sVar4;
  ostream *poVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double value;
  double dVar10;
  double value_00;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double approxOPIM;
  double upperOPT;
  double lowerSelect;
  double upperDegOPT;
  double upperBound;
  double degVldt;
  double infVldt;
  double time2;
  double infSelf;
  double time1;
  double a2;
  double a1;
  double approx;
  double e;
  Timer timerOPIM;
  int mode_local;
  double delta_local;
  size_t numRRsets_local;
  int targetSize_local;
  Alg *this_local;
  
  timerOPIM.__processName._4_4_ = mode;
  Timer::Timer((Timer *)&e,"OPIM");
  dVar6 = exp(1.0);
  dVar7 = log(2.0 / delta);
  dVar8 = log(2.0 / delta);
  HyperGraph::build_n_RRsets(&this->__hyperG,numRRsets >> 1);
  HyperGraph::build_n_RRsets(&this->__hyperGVldt,numRRsets >> 1);
  sVar4 = HyperGraph::get_RR_sets_size(&this->__hyperG);
  this->__numRRsets = sVar4;
  dVar9 = Timer::get_operation_time((Timer *)&e);
  value = max_cover(this,targetSize,timerOPIM.__processName._4_4_);
  dVar10 = Timer::get_operation_time((Timer *)&e);
  value_00 = HyperGraph::self_inf_cal(&this->__hyperGVldt,&this->__vecSeed);
  sVar4 = this->__numRRsets;
  auVar12._8_4_ = (int)(sVar4 >> 0x20);
  auVar12._0_8_ = sVar4;
  auVar12._12_4_ = 0x45300000;
  upperDegOPT = value / (1.0 - 1.0 / dVar6);
  if (timerOPIM.__processName._4_4_ == 1) {
    upperDegOPT = this->__boundLast;
  }
  else if (timerOPIM.__processName._4_4_ == 2) {
    upperDegOPT = this->__boundMin;
  }
  sVar1 = this->__numRRsets;
  auVar13._8_4_ = (int)(sVar1 >> 0x20);
  auVar13._0_8_ = sVar1;
  auVar13._12_4_ = 0x45300000;
  uVar2 = this->__numV;
  dVar6 = sqrt((value_00 *
               ((auVar12._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0))) /
               (double)this->__numV + (dVar7 * 2.0) / 9.0);
  dVar11 = sqrt(dVar7 / 2.0);
  dVar6 = pow2(dVar6 - dVar11);
  dVar11 = sqrt((upperDegOPT *
                ((auVar13._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0))) / (double)uVar2 +
                dVar8 / 2.0);
  dVar8 = sqrt(dVar8 / 2.0);
  dVar8 = pow2(dVar11 + dVar8);
  dVar8 = (dVar6 - dVar7 / 18.0) / dVar8;
  ResultInfo::set_approximation(this->__tRes,dVar8);
  pRVar3 = this->__tRes;
  dVar6 = Timer::get_total_time((Timer *)&e);
  ResultInfo::set_running_time(pRVar3,dVar6);
  ResultInfo::set_influence(this->__tRes,value_00);
  ResultInfo::set_influence_original(this->__tRes,value);
  ResultInfo::set_seed_vec(this->__tRes,&this->__vecSeed);
  ResultInfo::set_RR_sets_size(this->__tRes,this->__numRRsets << 1);
  poVar5 = std::operator<<((ostream *)&std::cout,"==>OPIM approx. (max-cover): ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar8);
  poVar5 = std::operator<<(poVar5," (");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,value / upperDegOPT);
  std::operator<<(poVar5,")\n");
  poVar5 = std::operator<<((ostream *)&std::cout,"==>Time for RR sets and greedy: ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar9);
  poVar5 = std::operator<<(poVar5,", ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar10);
  std::operator<<(poVar5,'\n');
  pRVar3 = this->__tRes;
  dVar6 = effic_inf_valid_algo(this);
  ResultInfo::set_influence(pRVar3,dVar6);
  return dVar8;
}

Assistant:

double Alg::opim(const int targetSize, const size_t numRRsets, const double delta, const int mode)
{
    Timer timerOPIM("OPIM");
    const double e = exp(1);
    const double approx = 1 - 1.0 / e;
    const double a1 = log(2.0 / delta);
    const double a2 = log(2.0 / delta);
    __hyperG.build_n_RRsets(numRRsets / 2); // R1
    __hyperGVldt.build_n_RRsets(numRRsets / 2); // R2
    __numRRsets = __hyperG.get_RR_sets_size();
    const auto time1 = timerOPIM.get_operation_time();
    const auto infSelf = max_cover(targetSize, mode);
    const auto time2 = timerOPIM.get_operation_time();
    const auto infVldt = __hyperGVldt.self_inf_cal(__vecSeed);
    const auto degVldt = infVldt * __numRRsets / __numV;
    auto upperBound = infSelf / approx;
    if (mode == 1) upperBound = __boundLast;
    else if (mode == 2) upperBound = __boundMin;
    const auto upperDegOPT = upperBound * __numRRsets / __numV;
    const auto lowerSelect = pow2(sqrt(degVldt + a1 * 2.0 / 9.0) - sqrt(a1 / 2.0)) - a1 / 18.0;
    const auto upperOPT = pow2(sqrt(upperDegOPT + a2 / 2.0) + sqrt(a2 / 2.0));
    const auto approxOPIM = lowerSelect / upperOPT;
    //guaranteeOpt = opt_error(degVldt, degSelfUpper, delta);
    __tRes.set_approximation(approxOPIM);
    __tRes.set_running_time(timerOPIM.get_total_time());
    __tRes.set_influence(infVldt);
    __tRes.set_influence_original(infSelf);
    __tRes.set_seed_vec(__vecSeed);
    __tRes.set_RR_sets_size(__numRRsets * 2);
    std::cout << "==>OPIM approx. (max-cover): " << approxOPIM << " (" << infSelf / upperBound << ")\n";
    std::cout << "==>Time for RR sets and greedy: " << time1 << ", " << time2 << '\n';
    __tRes.set_influence(effic_inf_valid_algo());
    return approxOPIM;
}